

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_plugin.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  iVar1 = google::protobuf::compiler::ProtobufMain(argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
#ifdef _MSC_VER
  // Don't print a silly message or stick a modal dialog box in my face,
  // please.
  _set_abort_behavior(0, ~0);
#endif  // !_MSC_VER
  return google::protobuf::compiler::ProtobufMain(argc, argv);
}